

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol_p.h
# Opt level: O2

QString * __thiscall
QWidgetLineControl::surroundingText(QString *__return_storage_ptr__,QWidgetLineControl *this)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  
  if (*(long *)(this + 0x20) == 0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("",1);
    QVar2.m_data = psVar1;
    QVar2.m_size = (qsizetype)__return_storage_ptr__;
    QString::fromLatin1(QVar2);
  }
  else {
    QArrayDataPointer<char16_t>::QArrayDataPointer
              (&__return_storage_ptr__->d,(QArrayDataPointer<char16_t> *)(this + 0x18));
  }
  return __return_storage_ptr__;
}

Assistant:

QString surroundingText() const
    {
        return m_text.isNull() ? QString::fromLatin1("") : m_text;
    }